

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setJoinExpr(Expr *p,int iTable)

{
  for (; p != (Expr *)0x0; p = p->pRight) {
    *(byte *)&p->flags = (byte)p->flags | 1;
    p->iRightJoinTable = (i16)iTable;
    setJoinExpr(p->pLeft,iTable);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasAnyProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetIrreducible(p);
    p->iRightJoinTable = (i16)iTable;
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}